

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::saveVectors(FastText *this)

{
  byte bVar1;
  int32_t iVar2;
  invalid_argument *this_00;
  element_type *peVar3;
  ostream *poVar4;
  ostream *this_01;
  element_type *peVar5;
  ostream *os;
  string *in_RDI;
  string word;
  int32_t i;
  Vector vec;
  ofstream ofs;
  char *in_stack_fffffffffffffce0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce8;
  ostream *in_stack_fffffffffffffcf0;
  int32_t id;
  int iVar6;
  char *in_stack_fffffffffffffd00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd08;
  string *vec_00;
  FastText *in_stack_fffffffffffffd40;
  int local_29c;
  string local_258 [48];
  string local_228 [32];
  ostream local_208 [520];
  
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x169521);
  vec_00 = local_228;
  std::operator+(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  std::ofstream::ofstream(local_208,vec_00,_S_out);
  std::__cxx11::string::~string(local_228);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1695a9);
    std::operator+(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    std::operator+(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
    std::invalid_argument::invalid_argument(this_00,local_258);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  peVar3 = std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1696df);
  iVar2 = Dictionary::nwords(peVar3);
  poVar4 = (ostream *)std::ostream::operator<<(local_208,iVar2);
  this_01 = std::operator<<(poVar4," ");
  peVar5 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x169727);
  os = (ostream *)std::ostream::operator<<(this_01,peVar5->dim);
  std::ostream::operator<<(os,std::endl<char,std::char_traits<char>>);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x169758);
  Vector::Vector((Vector *)poVar4,(int64_t)this_01);
  local_29c = 0;
  while( true ) {
    id = (int32_t)((ulong)in_stack_fffffffffffffcf0 >> 0x20);
    iVar6 = local_29c;
    peVar3 = std::
             __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x16978f);
    iVar2 = Dictionary::nwords(peVar3);
    if (iVar2 <= iVar6) break;
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1697bb);
    Dictionary::getWord_abi_cxx11_((Dictionary *)CONCAT44(iVar2,iVar6),id);
    getWordVector(in_stack_fffffffffffffd40,(Vector *)vec_00,in_RDI);
    in_stack_fffffffffffffcf0 = std::operator<<(local_208,(string *)&stack0xfffffffffffffd40);
    std::operator<<(in_stack_fffffffffffffcf0," ");
    poVar4 = operator<<(os,(Vector *)CONCAT44(iVar2,iVar6));
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd40);
    local_29c = local_29c + 1;
  }
  std::ofstream::close();
  Vector::~Vector((Vector *)0x1698b9);
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void FastText::saveVectors() {
  std::ofstream ofs(args_->output + ".vec");
  if (!ofs.is_open()) {
    throw std::invalid_argument(
        args_->output + ".vec" + " cannot be opened for saving vectors!");
  }
  ofs << dict_->nwords() << " " << args_->dim << std::endl;
  Vector vec(args_->dim);
  for (int32_t i = 0; i < dict_->nwords(); i++) {
    std::string word = dict_->getWord(i);
    getWordVector(vec, word);
    ofs << word << " " << vec << std::endl;
  }
  ofs.close();
}